

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_utils.cpp
# Opt level: O2

bool SignSignature(SigningProvider *provider,CTransaction *txFrom,CMutableTransaction *txTo,uint nIn
                  ,int nHashType,SignatureData *sig_data)

{
  pointer pCVar1;
  pointer pCVar2;
  uint __line;
  bool bVar3;
  long lVar4;
  char *__assertion;
  ulong uVar5;
  long in_FS_OFFSET;
  
  pCVar1 = (txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)nIn <
      (ulong)(((long)(txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar1) / 0x68)) {
    uVar5 = (ulong)pCVar1[nIn].prevout.n;
    pCVar2 = (txFrom->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(txFrom->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pCVar2;
    if (uVar5 < (ulong)(lVar4 / 0x28)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
        bVar3 = SignSignature(provider,&pCVar2[uVar5].scriptPubKey,txTo,nIn,&pCVar2[uVar5].nValue,
                              nHashType,sig_data);
        return bVar3;
      }
      __stack_chk_fail(provider,0x28,lVar4 % 0x28);
    }
    __assertion = "txin.prevout.n < txFrom.vout.size()";
    __line = 0x6d;
  }
  else {
    __assertion = "nIn < txTo.vin.size()";
    __line = 0x6b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/transaction_utils.cpp"
                ,__line,
                "bool SignSignature(const SigningProvider &, const CTransaction &, CMutableTransaction &, unsigned int, int, SignatureData &)"
               );
}

Assistant:

bool SignSignature(const SigningProvider &provider, const CTransaction& txFrom, CMutableTransaction& txTo, unsigned int nIn, int nHashType, SignatureData& sig_data)
{
    assert(nIn < txTo.vin.size());
    const CTxIn& txin = txTo.vin[nIn];
    assert(txin.prevout.n < txFrom.vout.size());
    const CTxOut& txout = txFrom.vout[txin.prevout.n];

    return SignSignature(provider, txout.scriptPubKey, txTo, nIn, txout.nValue, nHashType, sig_data);
}